

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

int32_t uloc_addLikelySubtags_63
                  (char *localeID,char *maximizedLocaleID,int32_t maximizedLocaleIDCapacity,
                  UErrorCode *err)

{
  UBool UVar1;
  char local_d8 [8];
  char localeBuffer [157];
  UErrorCode *err_local;
  int32_t maximizedLocaleIDCapacity_local;
  char *maximizedLocaleID_local;
  char *localeID_local;
  
  UVar1 = do_canonicalize(localeID,local_d8,0x9d,err);
  if (UVar1 == '\0') {
    localeID_local._4_4_ = -1;
  }
  else {
    localeID_local._4_4_ =
         _uloc_addLikelySubtags(local_d8,maximizedLocaleID,maximizedLocaleIDCapacity,err);
  }
  return localeID_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_addLikelySubtags(const char*    localeID,
         char* maximizedLocaleID,
         int32_t maximizedLocaleIDCapacity,
         UErrorCode* err)
{
    char localeBuffer[ULOC_FULLNAME_CAPACITY];

    if (!do_canonicalize(
        localeID,
        localeBuffer,
        sizeof(localeBuffer),
        err)) {
        return -1;
    }
    else {
        return _uloc_addLikelySubtags(
                    localeBuffer,
                    maximizedLocaleID,
                    maximizedLocaleIDCapacity,
                    err);
    }    
}